

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise::forward_int8
          (ConvolutionDepthWise *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  float fVar3;
  void *pvVar4;
  float *pfVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  Mat *pMVar8;
  int iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  undefined4 *puVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  int k;
  ulong uVar29;
  float *pfVar30;
  int iVar31;
  ulong __n;
  bool bVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  vector<int,_std::allocator<int>_> _space_ofs;
  long local_1b8;
  allocator_type local_1a9;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  int local_18c;
  void *local_188;
  ulong local_180;
  Mat *local_178;
  ulong local_170;
  int local_164;
  ulong local_160;
  Mat local_158;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  Mat local_c0;
  Option local_78;
  
  iVar15 = bottom_blob->c;
  iVar22 = -100;
  if ((iVar15 % this->group == 0) && (this->num_output % this->group == 0)) {
    iVar31 = this->kernel_w;
    iVar19 = this->dilation_w;
    iVar13 = this->kernel_h;
    iVar14 = this->dilation_h;
    local_c0.elemsize = bottom_blob->elemsize;
    local_c0.data = bottom_blob->data;
    local_c0.refcount = bottom_blob->refcount;
    local_c0.elempack = bottom_blob->elempack;
    local_c0.allocator = bottom_blob->allocator;
    local_c0.dims = bottom_blob->dims;
    local_c0.w = bottom_blob->w;
    local_c0.h = bottom_blob->h;
    local_c0.d = bottom_blob->d;
    local_c0.cstep = bottom_blob->cstep;
    if (local_c0.refcount != (int *)0x0) {
      LOCK();
      *local_c0.refcount = *local_c0.refcount + 1;
      UNLOCK();
    }
    local_178 = top_blob;
    local_c0.c = iVar15;
    if (local_c0.elemsize != 1) {
      uVar21 = (long)iVar15 / (long)this->group;
      local_158.cstep = 0;
      local_158.data = (undefined4 *)0x0;
      local_158.refcount._0_4_ = 0;
      local_158.refcount._4_4_ = 0;
      local_158.elemsize._0_4_ = 0;
      local_158.elemsize._4_4_ = 0;
      local_158.elempack = 0;
      local_158.allocator = (Allocator *)0x0;
      local_158.dims = 0;
      local_158.w = 0;
      local_158.h = 0;
      local_158.d = 0;
      local_158.c = 0;
      Mat::create(&local_158,iVar15,4,(Allocator *)0x0);
      iVar22 = this->group;
      if (0 < (long)iVar22) {
        pvVar4 = (this->bottom_blob_int8_scales).data;
        lVar24 = 0;
        puVar20 = (undefined4 *)local_158.data;
        do {
          if (0 < (int)uVar21) {
            uVar1 = *(undefined4 *)((long)pvVar4 + lVar24 * 4);
            uVar28 = uVar21 & 0xffffffff;
            do {
              *puVar20 = uVar1;
              puVar20 = puVar20 + 1;
              uVar25 = (int)uVar28 - 1;
              uVar28 = (ulong)uVar25;
            } while (uVar25 != 0);
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 != iVar22);
      }
      local_78._0_8_ = *(undefined8 *)opt;
      local_78.workspace_allocator = opt->workspace_allocator;
      local_78.openmp_blocktime = opt->openmp_blocktime;
      local_78.use_winograd_convolution = opt->use_winograd_convolution;
      local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
      local_78.use_int8_inference = opt->use_int8_inference;
      local_78.use_vulkan_compute = opt->use_vulkan_compute;
      local_78.use_bf16_storage = opt->use_bf16_storage;
      local_78.use_fp16_packed = opt->use_fp16_packed;
      local_78.use_fp16_storage = opt->use_fp16_storage;
      local_78.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      local_78.use_int8_packed = opt->use_int8_packed;
      local_78.use_int8_storage = opt->use_int8_storage;
      local_78.use_int8_arithmetic = opt->use_int8_arithmetic;
      local_78.use_packing_layout = opt->use_packing_layout;
      local_78.use_shader_pack8 = opt->use_shader_pack8;
      local_78.use_subgroup_basic = opt->use_subgroup_basic;
      local_78.use_subgroup_vote = opt->use_subgroup_vote;
      local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
      local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      local_78.use_image_storage = opt->use_image_storage;
      local_78.use_tensor_storage = opt->use_tensor_storage;
      local_78.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      local_78.flush_denormals = opt->flush_denormals;
      local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
      local_78.use_reserved_1 = opt->use_reserved_1;
      local_78.use_reserved_2 = opt->use_reserved_2;
      local_78.use_reserved_3 = opt->use_reserved_3;
      local_78.use_reserved_4 = opt->use_reserved_4;
      local_78.use_reserved_5 = opt->use_reserved_5;
      local_78.use_reserved_6 = opt->use_reserved_6;
      local_78.use_reserved_7 = opt->use_reserved_7;
      local_78.use_reserved_8 = opt->use_reserved_8;
      local_78.use_reserved_9 = opt->use_reserved_9;
      local_78.use_reserved_10 = opt->use_reserved_10;
      local_78.use_reserved_11 = opt->use_reserved_11;
      local_78.blob_allocator = opt->workspace_allocator;
      quantize_to_int8(bottom_blob,&local_c0,&local_158,&local_78);
      piVar6 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_158.allocator == (Allocator *)0x0) {
            if ((undefined4 *)local_158.data != (undefined4 *)0x0) {
              free(local_158.data);
            }
          }
          else {
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    local_158.cstep = 0;
    local_158.data = (void *)0x0;
    local_158.refcount._0_4_ = 0;
    local_158.refcount._4_4_ = 0;
    local_158.elemsize._0_4_ = 0;
    local_158.elemsize._4_4_ = 0;
    local_158.elempack = 0;
    local_158.allocator = (Allocator *)0x0;
    local_158.dims = 0;
    local_158.w = 0;
    local_158.h = 0;
    local_158.d = 0;
    local_158.c = 0;
    make_padding(this,&local_c0,&local_158,this->kernel_w,this->kernel_h,opt);
    iVar9 = local_158.w;
    iVar22 = -100;
    if ((local_158.data != (void *)0x0) && ((long)local_158.c * local_158.cstep != 0)) {
      uVar21 = (long)(~((iVar31 + -1) * iVar19) + local_158.w) / (long)this->stride_w;
      uVar28 = (long)(~((iVar13 + -1) * iVar14) + local_158.h) / (long)this->stride_h;
      uVar23 = uVar28 & 0xffffffff;
      __n = (long)this->kernel_h * (long)this->kernel_w;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_78,__n,&local_1a9);
      uVar11 = local_78._0_8_;
      pMVar8 = local_178;
      iVar22 = this->kernel_h;
      if (0 < iVar22) {
        iVar31 = this->dilation_h;
        iVar19 = this->kernel_w;
        iVar13 = this->dilation_w * iVar19;
        iVar14 = 0;
        iVar18 = 0;
        iVar26 = 0;
        do {
          if (0 < iVar19) {
            lVar24 = 0;
            do {
              *(int *)(local_78._0_8_ + (iVar14 + lVar24) * 4) = iVar18;
              iVar18 = iVar18 + this->dilation_w;
              iVar19 = this->kernel_w;
              lVar24 = lVar24 + 1;
            } while ((int)lVar24 < iVar19);
            iVar14 = iVar14 + (int)lVar24;
            iVar22 = this->kernel_h;
          }
          iVar18 = iVar18 + (iVar9 * iVar31 - iVar13);
          iVar26 = iVar26 + 1;
        } while (iVar26 < iVar22);
      }
      local_18c = this->int8_scale_term;
      local_180 = uVar21 & 0xffffffff;
      Mat::create(local_178,(int)uVar21 + 1,(int)uVar28 + 1,this->num_output,
                  (ulong)(local_18c < 0x65) * 3 + 1,opt->blob_allocator);
      iVar22 = -100;
      if ((pMVar8->data != (void *)0x0) && ((long)pMVar8->c * pMVar8->cstep != 0)) {
        iVar22 = this->group;
        iVar31 = (int)__n;
        if (iVar22 == this->num_output && iVar15 == iVar22) {
          if (0 < iVar15) {
            auVar7._8_8_ = 0;
            auVar7._0_8_ = local_108._8_8_;
            local_108 = auVar7 << 0x40;
            lVar24 = 0;
            local_1a8 = uVar23;
            do {
              if (-1 < (int)local_1a8) {
                local_188 = (void *)(local_158.cstep * lVar24 *
                                     CONCAT44(local_158.elemsize._4_4_,
                                              (undefined4)local_158.elemsize) + (long)local_158.data
                                    );
                pfVar30 = (float *)(local_178->cstep * lVar24 * local_178->elemsize +
                                   (long)local_178->data);
                local_198 = (long)local_158.w *
                            CONCAT44(local_158.elemsize._4_4_,(undefined4)local_158.elemsize);
                pvVar4 = (this->weight_data).data;
                uVar10 = local_108._0_8_;
                local_1a0 = 0;
                do {
                  if (-1 < (int)local_180) {
                    lVar16 = (long)(int)local_1a0;
                    iVar15 = 0;
                    do {
                      fVar35 = 0.0;
                      fVar33 = 0.0;
                      if (0 < iVar31) {
                        uVar21 = 0;
                        iVar22 = 0;
                        do {
                          iVar22 = iVar22 + (int)*(char *)((long)pvVar4 + uVar21 + uVar10) *
                                            (int)*(char *)((long)local_188 +
                                                          (long)*(int *)(uVar11 + uVar21 * 4) +
                                                          this->stride_h * lVar16 * local_198 +
                                                          (long)iVar15 * (long)this->stride_w);
                          uVar21 = uVar21 + 1;
                        } while ((__n & 0xffffffff) != uVar21);
                        fVar33 = (float)iVar22;
                      }
                      fVar2 = *(float *)((long)(this->weight_data_int8_scales).data + lVar24 * 4);
                      if (fVar2 != 0.0) {
                        fVar35 = 1.0 / (fVar2 * *(float *)((long)(this->bottom_blob_int8_scales).
                                                                 data + lVar24 * 4));
                      }
                      fVar35 = fVar35 * fVar33;
                      if (this->bias_term != 0) {
                        fVar35 = fVar35 + *(float *)((long)(this->bias_data).data + lVar24 * 4);
                      }
                      fVar33 = fVar35;
                      switch(this->activation_type) {
                      case 1:
                        if (fVar35 <= 0.0) {
                          fVar33 = 0.0;
                        }
                        break;
                      case 2:
                        fVar33 = (float)(~-(uint)(0.0 < fVar35) & *(this->activation_params).data |
                                        -(uint)(0.0 < fVar35) & 0x3f800000) * fVar35;
                        break;
                      case 3:
                        pfVar5 = (float *)(this->activation_params).data;
                        fVar33 = *pfVar5;
                        if (fVar35 <= fVar33) {
                          fVar35 = fVar33;
                        }
                        fVar2 = pfVar5[1];
                        fVar33 = fVar35;
                        if (fVar2 <= fVar35) {
                          fVar33 = fVar2;
                        }
                        break;
                      case 4:
                        fVar33 = expf(-fVar35);
                        fVar33 = 1.0 / (fVar33 + 1.0);
                        break;
                      case 5:
                        local_f8 = ZEXT416((uint)fVar35);
                        fVar33 = expf(fVar35);
                        fVar33 = logf(fVar33 + 1.0);
                        fVar33 = tanhf(fVar33);
                        fVar33 = fVar33 * (float)local_f8._0_4_;
                        break;
                      case 6:
                        pfVar5 = (float *)(this->activation_params).data;
                        fVar2 = *pfVar5;
                        fVar3 = pfVar5[1];
                        fVar34 = -fVar3 / fVar2;
                        fVar33 = 0.0;
                        if ((fVar34 <= fVar35) && (fVar33 = fVar35, fVar35 <= fVar34 + 1.0 / fVar2))
                        {
                          fVar33 = (fVar2 * fVar35 + fVar3) * fVar35;
                        }
                      }
                      if (local_18c < 0x65) {
                        *pfVar30 = fVar33;
                        lVar17 = 4;
                      }
                      else {
                        fVar33 = roundf(fVar33 * *(float *)((long)(this->top_blob_int8_scales).data
                                                           + lVar24 * 4));
                        iVar22 = (int)fVar33;
                        if (iVar22 < -0x7e) {
                          iVar22 = -0x7f;
                        }
                        uVar12 = (undefined1)iVar22;
                        if (0x7e < iVar22) {
                          uVar12 = 0x7f;
                        }
                        *(undefined1 *)pfVar30 = uVar12;
                        lVar17 = 1;
                      }
                      pfVar30 = (float *)((long)pfVar30 + lVar17);
                      bVar32 = iVar15 != (int)local_180;
                      iVar15 = iVar15 + 1;
                    } while (bVar32);
                  }
                  iVar15 = (int)local_1a0;
                  local_1a0 = (ulong)(iVar15 + 1);
                } while (iVar15 != (int)local_1a8);
              }
              lVar24 = lVar24 + 1;
              local_108._0_8_ = local_108._0_8_ + __n;
            } while (lVar24 < this->group);
          }
        }
        else {
          uVar21 = (long)iVar15 / (long)iVar22;
          if (0 < iVar22) {
            uVar27 = uVar21 & 0xffffffff;
            uVar28 = (long)this->num_output / (long)iVar22;
            local_160 = uVar28 & 0xffffffff;
            iVar19 = (int)uVar21 * iVar31;
            iVar15 = (int)uVar28;
            local_164 = iVar15 * iVar19;
            local_d8 = (long)iVar19;
            local_e0 = (long)iVar15;
            local_1b8 = 0;
            local_188 = (void *)CONCAT44(local_188._4_4_,(int)uVar21);
            local_1a8 = uVar23;
            do {
              if (0 < (int)local_160) {
                local_c8 = local_1b8 * local_e0;
                local_d0 = (long)(local_164 * (int)local_1b8);
                local_170 = 0;
                do {
                  if (-1 < (int)local_1a8) {
                    local_f8._0_8_ = local_170 + local_c8;
                    pfVar30 = (float *)(local_178->cstep * (local_170 + local_c8) *
                                        local_178->elemsize + (long)local_178->data);
                    local_1a0 = (long)(this->weight_data).data + local_170 * local_d8 + local_d0;
                    local_198 = 0;
                    do {
                      if (-1 < (int)local_180) {
                        iVar15 = 0;
                        do {
                          fVar35 = 0.0;
                          fVar33 = 0.0;
                          if (0 < (int)local_188) {
                            uVar23 = 0;
                            iVar22 = 0;
                            uVar28 = local_1a0;
                            do {
                              if (0 < iVar31) {
                                uVar29 = 0;
                                do {
                                  iVar22 = iVar22 + (int)*(char *)(uVar28 + uVar29) *
                                                    (int)*(char *)((long)local_158.data +
                                                                  (long)*(int *)(uVar11 + uVar29 * 4
                                                                                ) +
                                                                  (uVar23 + (uint)((int)uVar27 *
                                                                                  (int)local_1b8)) *
                                                                  local_158.cstep *
                                                                  CONCAT44(local_158.elemsize._4_4_,
                                                                           (undefined4)
                                                                           local_158.elemsize) +
                                                                  (long)iVar15 *
                                                                  (long)this->stride_w +
                                                                  (long)local_158.w *
                                                                  CONCAT44(local_158.elemsize._4_4_,
                                                                           (undefined4)
                                                                           local_158.elemsize) *
                                                                  (long)(int)local_198 *
                                                                  (long)this->stride_h);
                                  uVar29 = uVar29 + 1;
                                } while ((__n & 0xffffffff) != uVar29);
                              }
                              uVar28 = uVar28 + __n;
                              uVar23 = uVar23 + 1;
                            } while (uVar23 != (uVar21 & 0xffffffff));
                            fVar33 = (float)iVar22;
                          }
                          fVar2 = *(float *)((long)(this->weight_data_int8_scales).data +
                                            local_1b8 * 4);
                          if (fVar2 != 0.0) {
                            fVar35 = 1.0 / (fVar2 * *(float *)((long)(this->bottom_blob_int8_scales)
                                                                     .data + local_1b8 * 4));
                          }
                          fVar35 = fVar35 * fVar33;
                          if (this->bias_term != 0) {
                            fVar35 = fVar35 + *(float *)((long)(this->bias_data).data +
                                                        local_f8._0_8_ * 4);
                          }
                          fVar33 = fVar35;
                          switch(this->activation_type) {
                          case 1:
                            if (fVar35 <= 0.0) {
                              fVar33 = 0.0;
                            }
                            break;
                          case 2:
                            fVar33 = (float)(~-(uint)(0.0 < fVar35) &
                                             *(this->activation_params).data |
                                            -(uint)(0.0 < fVar35) & 0x3f800000) * fVar35;
                            break;
                          case 3:
                            pfVar5 = (float *)(this->activation_params).data;
                            fVar33 = *pfVar5;
                            if (fVar35 <= fVar33) {
                              fVar35 = fVar33;
                            }
                            fVar2 = pfVar5[1];
                            fVar33 = fVar35;
                            if (fVar2 <= fVar35) {
                              fVar33 = fVar2;
                            }
                            break;
                          case 4:
                            fVar33 = expf(-fVar35);
                            fVar33 = 1.0 / (fVar33 + 1.0);
                            break;
                          case 5:
                            local_108 = ZEXT416((uint)fVar35);
                            fVar33 = expf(fVar35);
                            fVar33 = logf(fVar33 + 1.0);
                            fVar33 = tanhf(fVar33);
                            fVar33 = fVar33 * (float)local_108._0_4_;
                            break;
                          case 6:
                            pfVar5 = (float *)(this->activation_params).data;
                            fVar2 = *pfVar5;
                            fVar3 = pfVar5[1];
                            fVar34 = -fVar3 / fVar2;
                            fVar33 = 0.0;
                            if ((fVar34 <= fVar35) &&
                               (fVar33 = fVar35, fVar35 <= fVar34 + 1.0 / fVar2)) {
                              fVar33 = (fVar2 * fVar35 + fVar3) * fVar35;
                            }
                          }
                          if (local_18c < 0x65) {
                            *pfVar30 = fVar33;
                            lVar24 = 4;
                          }
                          else {
                            fVar33 = roundf(fVar33 * *(float *)((long)(this->top_blob_int8_scales).
                                                                      data + local_1b8 * 4));
                            iVar22 = (int)fVar33;
                            if (iVar22 < -0x7e) {
                              iVar22 = -0x7f;
                            }
                            uVar12 = (undefined1)iVar22;
                            if (0x7e < iVar22) {
                              uVar12 = 0x7f;
                            }
                            *(undefined1 *)pfVar30 = uVar12;
                            lVar24 = 1;
                          }
                          pfVar30 = (float *)((long)pfVar30 + lVar24);
                          bVar32 = iVar15 != (int)local_180;
                          iVar15 = iVar15 + 1;
                        } while (bVar32);
                      }
                      iVar15 = (int)local_198;
                      local_198 = (ulong)(iVar15 + 1);
                    } while (iVar15 != (int)local_1a8);
                  }
                  local_170 = local_170 + 1;
                } while (local_170 != local_160);
                iVar22 = this->group;
                uVar27 = (ulong)local_188 & 0xffffffff;
              }
              local_1b8 = local_1b8 + 1;
            } while (local_1b8 < iVar22);
          }
        }
        iVar22 = 0;
      }
      if ((pointer)local_78._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_78._0_8_,(long)local_78.workspace_allocator - local_78._0_8_);
      }
    }
    piVar6 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (local_158.allocator == (Allocator *)0x0) {
          if (local_158.data != (void *)0x0) {
            free(local_158.data);
          }
        }
        else {
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (local_c0.refcount != (int *)0x0) {
      LOCK();
      *local_c0.refcount = *local_c0.refcount + -1;
      UNLOCK();
      if (*local_c0.refcount == 0) {
        if (local_c0.allocator == (Allocator *)0x0) {
          if (local_c0.data != (void *)0x0) {
            free(local_c0.data);
          }
        }
        else {
          (*(local_c0.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return iVar22;
}

Assistant:

int ConvolutionDepthWise::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0 || num_output % group != 0)
    {
        // reject invalid group
        return -100;
    }

    //     NCNN_LOGE("ConvolutionDepthWise input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elemsize != 1)
    {
        const int channels_g = channels / group;

        Mat scales(channels);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // int8
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u : 4u;

    top_blob.create(outw, outh, num_output, out_elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // depth-wise
    if (channels == group && group == num_output)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int g = 0; g < group; g++)
        {
            signed char* outptr = top_blob.channel(g);
            const signed char* kptr = (const signed char*)weight_data + maxk * g;
            const Mat m = bottom_blob_bordered.channel(g);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                    for (int k = 0; k < maxk; k++)
                    {
                        signed char val = sptr[space_ofs[k]];
                        signed char w = kptr[k];
                        sum += val * w;
                    }

                    float scale_in;
                    if (weight_data_int8_scales[g] == 0)
                        scale_in = 0;
                    else
                        scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                    float sumfp32 = sum * scale_in;

                    if (bias_term)
                        sumfp32 += bias_data[g];

                    sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                    if (use_int8_requantize)
                    {
                        // requantize
                        float scale_out = top_blob_int8_scales[g];
                        signed char sums8 = float2int8(sumfp32 * scale_out);
                        outptr[0] = sums8;
                        outptr += 1;
                    }
                    else
                    {
                        // dequantize
                        ((float*)outptr)[0] = sumfp32;
                        outptr += 4;
                    }
                }
            }
        }
    }
    else
    {
        // group convolution
        const int channels_g = channels / group;
        const int num_output_g = num_output / group;

#ifdef _WIN32
        #pragma omp parallel for num_threads(opt.num_threads)
#else // _WIN32
        #pragma omp parallel for collapse(2) num_threads(opt.num_threads)
#endif // _WIN32
        for (int g = 0; g < group; g++)
        {
            for (int p = 0; p < num_output_g; p++)
            {
                signed char* outptr = top_blob.channel(g * num_output_g + p);
                const signed char* weight_data_ptr = (const signed char*)weight_data + maxk * channels_g * num_output_g * g;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        int sum = 0;

                        const signed char* kptr = weight_data_ptr + maxk * channels_g * p;

                        // channels_g
                        for (int q = 0; q < channels_g; q++)
                        {
                            const Mat m = bottom_blob_bordered.channel(channels_g * g + q);
                            const signed char* sptr = m.row<signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            kptr += maxk;
                        }

                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float sumfp32 = sum * scale_in;

                        if (bias_term)
                            sumfp32 += bias_data[g * num_output_g + p];

                        sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                        if (use_int8_requantize)
                        {
                            // requantize
                            float scale_out = top_blob_int8_scales[g];
                            signed char sums8 = float2int8(sumfp32 * scale_out);
                            outptr[0] = sums8;
                            outptr += 1;
                        }
                        else
                        {
                            // dequantize
                            ((float*)outptr)[0] = sumfp32;
                            outptr += 4;
                        }
                    }
                }
            }
        }
    }

    return 0;
}